

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_ternary_expression(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  gtoken_s token_00;
  gnode_t *stmt1;
  gnode_t *local_a8;
  undefined1 local_88 [8];
  gtoken_s end_token;
  gnode_t *expr2;
  gnode_t *expr1;
  gtoken_s token;
  gnode_t *cond;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  token.value = (char *)parser->current_node;
  if ((gnode_t *)token.value == (gnode_t *)0x0) {
    parser_local = (gravity_parser_t *)0x0;
  }
  else {
    gravity_lexer_token((gtoken_s *)&expr1,lexer_00);
    stmt1 = parse_expression(parser);
    if (stmt1 == (gnode_t *)0x0) {
      parser_local = (gravity_parser_t *)0x0;
    }
    else {
      parse_required(parser,TOK_OP_COLON);
      end_token.value = (char *)parse_expression(parser);
      if ((gnode_t *)end_token.value == (gnode_t *)0x0) {
        parser_local = (gravity_parser_t *)0x0;
      }
      else {
        gravity_lexer_token((gtoken_s *)local_88,lexer_00);
        if (parser->declarations->n == 0) {
          local_a8 = (gnode_t *)0x0;
        }
        else {
          local_a8 = parser->declarations->p[parser->declarations->n - 1];
        }
        token_00.position = token.lineno;
        token_00.colno = token.type;
        token_00._0_8_ = expr1;
        token_00.bytes = token.colno;
        token_00.length = token.position;
        token_00.fileid = token.bytes;
        token_00.builtin = token.length;
        token_00.value = (char *)token._24_8_;
        parser_local = (gravity_parser_t *)
                       gnode_flow_stat_create
                                 (token_00,(gnode_t *)token.value,stmt1,(gnode_t *)end_token.value,
                                  local_a8,(end_token.lineno + end_token.position) - token.lineno);
      }
    }
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *parse_ternary_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_ternary_expression");
    DECLARE_LEXER;

    // conditional expression already parsed
    gnode_t *cond = parser->current_node;
    if (!cond) return NULL;

    // '?' expression ':' expression

    // '?' already consumed
    gtoken_s token = gravity_lexer_token(lexer);

    // parse expression 1
    gnode_t *expr1 = parse_expression(parser);
    CHECK_NODE(expr1);

    parse_required(parser, TOK_OP_COLON);

    // parse expression 2
    gnode_t *expr2 = parse_expression(parser);
    CHECK_NODE(expr2);

	// read current token to extract node total length
	gtoken_s end_token = gravity_lexer_token(lexer);

    return gnode_flow_stat_create(token, cond, expr1, expr2, LAST_DECLARATION(), end_token.position + end_token.length - token.position);
}